

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O0

bool dxil_spv::emit_discard_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id arg;
  Value *value;
  Constant *this;
  APInt *this_00;
  uint64_t uVar2;
  Operation *this_01;
  Operation *op;
  ConstantInt *constant_int;
  bool has_condition;
  Value *cond;
  CallInst *instruction_local;
  Impl *impl_local;
  
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = false;
  this = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(value)->super_Constant;
  if (this == (Constant *)0x0) {
    bVar1 = true;
  }
  else {
    this_00 = LLVMBC::Constant::getUniqueInteger(this);
    uVar2 = LLVMBC::APInt::getZExtValue(this_00);
    if (uVar2 == 0) {
      return true;
    }
  }
  this_01 = Converter::Impl::allocate(impl,OpDemoteToHelperInvocation);
  if (bVar1) {
    arg = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(this_01,arg);
  }
  Converter::Impl::add(impl,this_01,false);
  SPIRVModule::enable_shader_discard(impl->spirv_module,(bool)((impl->options).shader_demote & 1));
  return true;
}

Assistant:

bool emit_discard_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto *cond = instruction->getOperand(1);
	bool has_condition = false;
	if (const auto *constant_int = llvm::dyn_cast<llvm::ConstantInt>(cond))
	{
		if (!constant_int->getUniqueInteger().getZExtValue())
			return true;
	}
	else
		has_condition = true;

	Operation *op = impl.allocate(spv::OpDemoteToHelperInvocationEXT);
	if (has_condition)
		op->add_id(impl.get_id_for_value(cond));
	impl.add(op);
	impl.spirv_module.enable_shader_discard(impl.options.shader_demote);
	return true;
}